

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_comparison_join.cpp
# Opt level: O3

InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
duckdb::PhysicalComparisonJoin::ParamsToString_abi_cxx11_
          (InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,PhysicalComparisonJoin *this)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  const_reference this_00;
  pointer pEVar3;
  ExpressionType type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  size_type __n;
  string condition_info;
  string local_f8;
  undefined1 *local_d8;
  undefined8 local_d0;
  undefined1 local_c8 [16];
  vector<duckdb::JoinCondition,_true> *local_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->map_idx)._M_h._M_buckets =
       &(__return_storage_ptr__->map_idx)._M_h._M_single_bucket;
  (__return_storage_ptr__->map_idx)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->map_idx)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->map_idx)._M_h._M_element_count = 0;
  (__return_storage_ptr__->map_idx)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->map_idx)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->map_idx)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pcVar1 = EnumUtil::ToChars<duckdb::JoinType>
                     ((this->super_PhysicalJoin).super_CachingPhysicalOperator.field_0x81);
  ::std::__cxx11::string::string((string *)&local_d8,pcVar1,(allocator *)&local_f8);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Join Type","");
  pbVar2 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](__return_storage_ptr__,&local_f8);
  ::std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  local_d8 = local_c8;
  local_d0 = 0;
  local_c8[0] = 0;
  if ((this->conditions).super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
      .super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->conditions).super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
      .super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_b8 = &this->conditions;
    __n = 0;
    do {
      this_00 = vector<duckdb::JoinCondition,_true>::operator[](local_b8,__n);
      if (__n != 0) {
        ::std::__cxx11::string::append((char *)&local_d8);
      }
      local_b0[0] = local_a0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"%s %s %s","");
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&this_00->left);
      (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[7])(&local_50,pEVar3);
      ExpressionTypeToOperator_abi_cxx11_(&local_70,(duckdb *)(ulong)this_00->comparison,type);
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&this_00->right);
      (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[7])(&local_90,pEVar3);
      StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (&local_f8,(StringUtil *)local_b0,&local_50,&local_70,&local_90,in_R9);
      ::std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_f8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0]);
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(this->conditions).
                                  super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                  .
                                  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->conditions).
                                  super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                  .
                                  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555));
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Conditions","");
  pbVar2 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](__return_storage_ptr__,&local_f8);
  ::std::__cxx11::string::_M_assign((string *)pbVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  PhysicalOperator::SetEstimatedCardinality
            (__return_storage_ptr__,
             (this->super_PhysicalJoin).super_CachingPhysicalOperator.super_PhysicalOperator.
             estimated_cardinality);
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

InsertionOrderPreservingMap<string> PhysicalComparisonJoin::ParamsToString() const {
	InsertionOrderPreservingMap<string> result;
	result["Join Type"] = EnumUtil::ToString(join_type);
	string condition_info;
	for (idx_t i = 0; i < conditions.size(); i++) {
		auto &join_condition = conditions[i];
		if (i > 0) {
			condition_info += "\n";
		}
		condition_info +=
		    StringUtil::Format("%s %s %s", join_condition.left->GetName(),
		                       ExpressionTypeToOperator(join_condition.comparison), join_condition.right->GetName());
		// string op = ExpressionTypeToOperator(it.comparison);
		// extra_info += it.left->GetName() + " " + op + " " + it.right->GetName() + "\n";
	}
	result["Conditions"] = condition_info;
	SetEstimatedCardinality(result, estimated_cardinality);
	return result;
}